

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::playSysexWithoutFraming(Synth *this,Bit8u *sysex,Bit32u len)

{
  Bit32u len_local;
  Bit8u *sysex_local;
  Synth *this_local;
  
  if (len < 4) {
    printDebug(this,"playSysexWithoutFraming: Message is too short (%d bytes)!",(ulong)len);
  }
  else if (*sysex == 'A') {
    if (sysex[2] == '\x14') {
      printDebug(this,
                 "playSysexWithoutFraming: Header is intended for model D-50 (not yet supported): %02x %02x %02x %02x"
                 ,(ulong)*sysex,(ulong)sysex[1],(ulong)sysex[2],(ulong)sysex[3]);
    }
    else if (sysex[2] == '\x16') {
      playSysexWithoutHeader(this,sysex[1],sysex[3],sysex + 4,len - 4);
    }
    else {
      printDebug(this,
                 "playSysexWithoutFraming: Header not intended for model MT-32: %02x %02x %02x %02x"
                 ,(ulong)*sysex,(ulong)sysex[1],(ulong)sysex[2],(ulong)sysex[3]);
    }
  }
  else {
    printDebug(this,
               "playSysexWithoutFraming: Header not intended for this device manufacturer: %02x %02x %02x %02x"
               ,(ulong)*sysex,(ulong)sysex[1],(ulong)sysex[2],(ulong)sysex[3]);
  }
  return;
}

Assistant:

void Synth::playSysexWithoutFraming(const Bit8u *sysex, Bit32u len) {
	if (len < 4) {
		printDebug("playSysexWithoutFraming: Message is too short (%d bytes)!", len);
		return;
	}
	if (sysex[0] != SYSEX_MANUFACTURER_ROLAND) {
		printDebug("playSysexWithoutFraming: Header not intended for this device manufacturer: %02x %02x %02x %02x", int(sysex[0]), int(sysex[1]), int(sysex[2]), int(sysex[3]));
		return;
	}
	if (sysex[2] == SYSEX_MDL_D50) {
		printDebug("playSysexWithoutFraming: Header is intended for model D-50 (not yet supported): %02x %02x %02x %02x", int(sysex[0]), int(sysex[1]), int(sysex[2]), int(sysex[3]));
		return;
	} else if (sysex[2] != SYSEX_MDL_MT32) {
		printDebug("playSysexWithoutFraming: Header not intended for model MT-32: %02x %02x %02x %02x", int(sysex[0]), int(sysex[1]), int(sysex[2]), int(sysex[3]));
		return;
	}
	playSysexWithoutHeader(sysex[1], sysex[3], sysex + 4, len - 4);
}